

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommychain.h
# Opt level: O2

void tommy_chain_merge_degenerated(tommy_chain *first,tommy_chain *second,undefined1 *cmp)

{
  tommy_node **pptVar1;
  long lVar2;
  tommy_node_struct *ptVar3;
  int iVar4;
  tommy_node *ptVar5;
  tommy_node_struct *ptVar6;
  tommy_node_struct *ptVar7;
  tommy_chain *ptVar8;
  long in_FS_OFFSET;
  bool bVar9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar8 = (tommy_chain *)&first->tail;
  iVar4 = (*(code *)cmp)(first->tail->data,second->head->data);
  if (iVar4 < 1) {
    ptVar7 = *(tommy_node_struct **)ptVar8;
    ptVar5 = second->head;
    ptVar5->prev = ptVar7;
    ptVar7->next = ptVar5;
    second = (tommy_chain *)&second->tail;
  }
  else {
    pptVar1 = &second->tail;
    iVar4 = (*(code *)cmp)(second->tail->data,first->head->data);
    if (-1 < iVar4) {
      ptVar7 = first->head;
      ptVar5 = second->head;
      do {
        while (iVar4 = (*(code *)cmp)(ptVar7->data,ptVar5->data), iVar4 < 1) {
          if (ptVar7 == *(tommy_node_struct **)ptVar8) {
            ptVar5->prev = ptVar7;
            ptVar7->next = ptVar5;
            second = (tommy_chain *)pptVar1;
            goto LAB_0010714a;
          }
          ptVar7 = ptVar7->next;
        }
        ptVar3 = ptVar5->next;
        if (ptVar7 == first->head) {
          ptVar7->prev = ptVar5;
          ptVar6 = (tommy_node_struct *)first;
        }
        else {
          ptVar6 = ptVar7->prev;
          ptVar7->prev = ptVar5;
          ptVar5->prev = ptVar6;
        }
        ptVar6->next = ptVar5;
        ptVar5->next = ptVar7;
        bVar9 = ptVar5 != *pptVar1;
        ptVar5 = ptVar3;
      } while (bVar9);
      goto LAB_00107151;
    }
    ptVar5 = *pptVar1;
    ptVar7 = first->head;
    ptVar7->prev = ptVar5;
    ptVar5->next = ptVar7;
    ptVar8 = first;
  }
LAB_0010714a:
  ptVar8->head = second->head;
LAB_00107151:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

tommy_inline void tommy_chain_merge_degenerated(tommy_chain* first, tommy_chain* second, tommy_compare_func* cmp)
{
	/* identify the condition first <= second */
	if (cmp(first->tail->data, second->head->data) <= 0) {
		tommy_chain_concat(first->tail, second->head);
		first->tail = second->tail;
		return;
	}

	/* identify the condition second < first */
	/* here we must be strict on comparison to keep the sort stable */
	if (cmp(second->tail->data, first->head->data) < 0) {
		tommy_chain_concat(second->tail, first->head);
		first->head = second->head;
		return;
	}

	tommy_chain_merge(first, second, cmp);
}